

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-create-socket-early.c
# Opt level: O1

int run_test_udp_create_early_bad_bind(void)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ushort *puVar6;
  bool bVar7;
  uv_os_fd_t fd;
  int namelen;
  sockaddr_in6 sockname;
  sockaddr_in addr;
  uv_udp_t client;
  undefined1 auStack_208 [216];
  code *pcStack_130;
  int local_11c [2];
  int local_114 [7];
  undefined1 local_f8 [16];
  long local_e8 [27];
  
  pcStack_130 = (code *)0x18738c;
  iVar2 = uv_interface_addresses(local_e8,local_114);
  if (iVar2 != 0) {
LAB_001874ec:
    pcStack_130 = (code *)0x1874f1;
    run_test_udp_create_early_bad_bind_cold_1();
    return 1;
  }
  if ((long)local_114[0] < 1) {
    pcStack_130 = (code *)0x1874ec;
    uv_free_interface_addresses();
    goto LAB_001874ec;
  }
  puVar6 = (ushort *)(local_e8[0] + 0x14);
  uVar3 = 1;
  do {
    uVar1 = *puVar6;
    uVar5 = (ulong)uVar1;
    if (uVar1 == 10) break;
    puVar6 = puVar6 + 0x28;
    bVar7 = uVar3 < (ulong)(long)local_114[0];
    uVar3 = uVar3 + 1;
  } while (bVar7);
  pcStack_130 = (code *)0x1873d3;
  uv_free_interface_addresses(local_e8[0]);
  if (uVar1 != 10) goto LAB_001874ec;
  pcStack_130 = (code *)0x1873f3;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_f8);
  if (iVar2 == 0) {
    pcStack_130 = (code *)0x187400;
    uVar4 = uv_default_loop();
    pcStack_130 = (code *)0x187412;
    iVar2 = uv_udp_init_ex(uVar4,local_e8,10);
    if (iVar2 != 0) goto LAB_001874fd;
    pcStack_130 = (code *)0x187429;
    iVar2 = uv_fileno(local_e8,local_11c);
    if (iVar2 != 0) goto LAB_00187502;
    if (local_11c[0] == -1) goto LAB_00187507;
    local_11c[1] = 0x1c;
    pcStack_130 = (code *)0x187456;
    iVar2 = uv_udp_getsockname(local_e8,local_114);
    if (iVar2 != 0) goto LAB_0018750c;
    if ((short)local_114[0] != 10) goto LAB_00187511;
    pcStack_130 = (code *)0x18747b;
    iVar2 = uv_udp_bind(local_e8,local_f8,0);
    if (iVar2 != -0x16) goto LAB_00187516;
    uVar5 = 0;
    pcStack_130 = (code *)0x187492;
    uv_close(local_e8,0);
    pcStack_130 = (code *)0x187497;
    uVar4 = uv_default_loop();
    pcStack_130 = (code *)0x1874a1;
    uv_run(uVar4,0);
    pcStack_130 = (code *)0x1874a6;
    uVar4 = uv_default_loop();
    pcStack_130 = (code *)0x1874ba;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_130 = (code *)0x1874c4;
    uv_run(uVar4,0);
    pcStack_130 = (code *)0x1874c9;
    uVar4 = uv_default_loop();
    pcStack_130 = (code *)0x1874d1;
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      pcStack_130 = (code *)0x1874da;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_130 = (code *)0x1874fd;
    run_test_udp_create_early_bad_bind_cold_2();
LAB_001874fd:
    pcStack_130 = (code *)0x187502;
    run_test_udp_create_early_bad_bind_cold_3();
LAB_00187502:
    pcStack_130 = (code *)0x187507;
    run_test_udp_create_early_bad_bind_cold_4();
LAB_00187507:
    pcStack_130 = (code *)0x18750c;
    run_test_udp_create_early_bad_bind_cold_9();
LAB_0018750c:
    pcStack_130 = (code *)0x187511;
    run_test_udp_create_early_bad_bind_cold_5();
LAB_00187511:
    pcStack_130 = (code *)0x187516;
    run_test_udp_create_early_bad_bind_cold_6();
LAB_00187516:
    pcStack_130 = (code *)0x18751b;
    run_test_udp_create_early_bad_bind_cold_7();
  }
  pcStack_130 = run_test_udp_create_early_bad_domain;
  run_test_udp_create_early_bad_bind_cold_8();
  pcStack_130 = (code *)uVar5;
  uVar4 = uv_default_loop();
  iVar2 = uv_udp_init_ex(uVar4,auStack_208,0x2f);
  if (iVar2 == -0x16) {
    uVar4 = uv_default_loop();
    iVar2 = uv_udp_init_ex(uVar4,auStack_208,0x400);
    if (iVar2 == -0x16) {
      uVar4 = uv_default_loop();
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001875bd;
    }
  }
  else {
    run_test_udp_create_early_bad_domain_cold_1();
  }
  run_test_udp_create_early_bad_domain_cold_2();
LAB_001875bd:
  run_test_udp_create_early_bad_domain_cold_3();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(uVar4,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(udp_create_early_bad_bind) {
  struct sockaddr_in addr;
  uv_udp_t client;
  uv_os_fd_t fd;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init_ex(uv_default_loop(), &client, AF_INET6);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  {
    int namelen;
    struct sockaddr_in6 sockname;
    namelen = sizeof sockname;
    r = uv_udp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
    ASSERT(r == 0);
    ASSERT(sockname.sin6_family == AF_INET6);
  }
#endif

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
#if !defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MSYS__)
  ASSERT(r == UV_EINVAL);
#else
  ASSERT(r == UV_EFAULT);
#endif

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}